

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawList *this;
  ImVec2 *pIVar2;
  float *pfVar3;
  ImGuiID IVar4;
  ImFontAtlas *pIVar5;
  ImGuiPopupRef *pIVar6;
  ImVec2 cr_max;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  byte bVar9;
  int i;
  int iVar10;
  ImGuiID IVar11;
  ImGuiTextBuffer *this_00;
  char *pcVar12;
  ImGuiIniData *pIVar13;
  long lVar14;
  ImGuiWindow *pIVar15;
  ImGuiWindow *pIVar16;
  ulong uVar17;
  ImGuiWindow **ppIVar18;
  ImGuiPopupRef *pIVar19;
  char cVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  ulong uVar24;
  ImGuiWindow **ppIVar25;
  ulong uVar26;
  char *pcVar27;
  char *pcVar28;
  uint uVar29;
  bool bVar30;
  ImVec2 IVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  ImVec2 IVar38;
  float fVar39;
  float y;
  int file_size;
  char name [64];
  float local_9c;
  ImGuiIniData *local_98;
  int local_90;
  int local_8c;
  char *local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  pIVar7 = GImGui;
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x825,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x826,"void ImGui::NewFrame()");
  }
  pIVar5 = (GImGui->IO).Fonts;
  if ((pIVar5->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x827,"void ImGui::NewFrame()");
  }
  if ((*(pIVar5->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x828,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x829,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    this_00 = (ImGuiTextBuffer *)(*(pIVar7->IO).MemAllocFn)(0x10);
    pIVar7->LogClipboard = this_00;
    ImGuiTextBuffer::ImGuiTextBuffer(this_00);
    if ((pIVar7->Settings).Size != 0) {
      __assert_fail("g.Settings.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x831,"void ImGui::NewFrame()");
    }
    local_80 = GImGui;
    pcVar12 = (GImGui->IO).IniFilename;
    if ((pcVar12 != (char *)0x0) &&
       (pcVar12 = (char *)ImLoadFileToMemory(pcVar12,"rb",&local_8c,1), local_88 = pcVar12,
       pcVar12 != (char *)0x0)) {
      if (0 < (long)local_8c) {
        pcVar28 = pcVar12 + local_8c;
        pIVar13 = (ImGuiIniData *)0x0;
        pcVar27 = pcVar12;
LAB_00130a24:
        do {
          if ((*pcVar12 != '\n') && (*pcVar12 != '\r')) {
            pcVar12 = pcVar12 + 1;
            if (pcVar12 < pcVar28) goto LAB_00130a24;
          }
          if (((pcVar27 < pcVar12) && (*pcVar27 == '[')) && (pcVar12[-1] == ']')) {
            ImFormatString((char *)local_78,0x40,"%.*s",(ulong)(((int)pcVar12 - (int)pcVar27) - 2),
                           pcVar27 + 1);
            pIVar13 = FindWindowSettings((char *)local_78);
            if (pIVar13 == (ImGuiIniData *)0x0) {
              pIVar13 = AddWindowSettings((char *)local_78);
            }
          }
          else if (pIVar13 == (ImGuiIniData *)0x0) {
            pIVar13 = (ImGuiIniData *)0x0;
          }
          else {
            local_98 = pIVar13;
            iVar10 = __isoc99_sscanf(pcVar27,"Pos=%f,%f",local_78);
            if (iVar10 == 2) {
              (local_98->Pos).x = local_78[0].x;
              (local_98->Pos).y = local_9c;
              pIVar13 = local_98;
            }
            else {
              iVar10 = __isoc99_sscanf(pcVar27,"Size=%f,%f",local_78,&local_9c);
              if (iVar10 == 2) {
                fVar35 = (local_80->Style).WindowMinSize.x;
                fVar33 = (local_80->Style).WindowMinSize.y;
                uVar21 = -(uint)(fVar35 <= local_78[0].x);
                IVar38.x = (float)(~uVar21 & (uint)fVar35 | (uint)local_78[0].x & uVar21);
                uVar21 = -(uint)(fVar33 <= local_9c);
                IVar38.y = (float)(~uVar21 & (uint)fVar33 | (uint)local_9c & uVar21);
                local_98->Size = IVar38;
                pIVar13 = local_98;
              }
              else {
                iVar10 = __isoc99_sscanf(pcVar27,"Collapsed=%d",&local_90);
                pIVar13 = local_98;
                if (iVar10 == 1) {
                  local_98->Collapsed = local_90 != 0;
                }
              }
            }
          }
          pcVar12 = pcVar12 + 1;
          pcVar27 = pcVar12;
        } while (pcVar12 < pcVar28);
      }
      pIVar8 = GImGui;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar8->IO).MemFreeFn)(local_88);
    }
    pIVar7->Initialized = true;
  }
  pIVar5 = (pIVar7->IO).Fonts;
  if ((pIVar5->Fonts).Size < 1) {
    pcVar12 = "value_type &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001318c2:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x353,pcVar12);
  }
  SetCurrentFont(*(pIVar5->Fonts).Data);
  pIVar7->Time = (pIVar7->IO).DeltaTime + pIVar7->Time;
  pIVar7->FrameCount = pIVar7->FrameCount + 1;
  pIVar7->Tooltip[0] = '\0';
  this = &pIVar7->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,&((pIVar7->IO).Fonts)->TexID);
  cr_max.y = GNullClipRect.w;
  cr_max.x = GNullClipRect.z;
  ImDrawList::PushClipRect(this,GNullClipRect._0_8_,cr_max,false);
  (pIVar7->RenderDrawData).Valid = false;
  (pIVar7->RenderDrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar7->RenderDrawData).CmdListsCount = 0;
  (pIVar7->RenderDrawData).TotalVtxCount = 0;
  (pIVar7->RenderDrawData).TotalIdxCount = 0;
  pIVar2 = &(pIVar7->IO).MousePos;
  if ((pIVar2->x <= 0.0 && pIVar2->x != 0.0) &&
     (pfVar3 = &(pIVar7->IO).MousePos.y, *pfVar3 <= 0.0 && *pfVar3 != 0.0)) {
    (pIVar7->IO).MousePos.x = -9999.0;
    (pIVar7->IO).MousePos.y = -9999.0;
  }
  fVar35 = (pIVar7->IO).MousePos.x;
  if (((fVar35 < 0.0) && (pfVar3 = &(pIVar7->IO).MousePos.y, *pfVar3 <= 0.0 && *pfVar3 != 0.0)) ||
     ((fVar33 = (pIVar7->IO).MousePosPrev.x, fVar33 < 0.0 &&
      (pfVar3 = &(pIVar7->IO).MousePosPrev.y, *pfVar3 <= 0.0 && *pfVar3 != 0.0)))) {
    (pIVar7->IO).MouseDelta.x = 0.0;
    (pIVar7->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar31.x = fVar35 - fVar33;
    IVar31.y = (pIVar7->IO).MousePos.y - (pIVar7->IO).MousePosPrev.y;
    (pIVar7->IO).MouseDelta = IVar31;
  }
  (pIVar7->IO).MousePosPrev = (pIVar7->IO).MousePos;
  lVar14 = 0x3a5;
  do {
    cVar20 = *(char *)((long)pIVar7 + lVar14 + -0x2a5);
    if (cVar20 == '\x01') {
      pfVar3 = (float *)((long)pIVar7 + lVar14 * 4 + -0xae4);
      bVar30 = *pfVar3 <= 0.0 && *pfVar3 != 0.0;
    }
    else {
      bVar30 = false;
    }
    *(bool *)((long)(pIVar7->IO).KeyMap + lVar14 + -0x7d) = bVar30;
    if (cVar20 == '\0') {
      bVar23 = 0.0 <= *(float *)((long)pIVar7 + lVar14 * 4 + -0xae4);
    }
    else {
      bVar23 = false;
    }
    *(bool *)((long)(pIVar7->IO).KeyMap + lVar14 + -0x34) = bVar23;
    fVar35 = *(float *)((long)pIVar7 + lVar14 * 4 + -0xae4);
    *(float *)((long)pIVar7 + lVar14 * 4 + -0xad0) = fVar35;
    fVar33 = -1.0;
    if ((cVar20 != '\0') && (fVar33 = 0.0, 0.0 <= fVar35)) {
      fVar33 = fVar35 + (pIVar7->IO).DeltaTime;
    }
    *(float *)((long)pIVar7 + lVar14 * 4 + -0xae4) = fVar33;
    *(undefined1 *)((long)(pIVar7->IO).KeyMap + lVar14 + -0x39) = 0;
    if (bVar30 == false) {
      if (cVar20 != '\0') {
        fVar35 = *(float *)((long)pIVar7 + lVar14 * 4 + -0xabc);
        fVar33 = (pIVar7->IO).MousePos.x - *(float *)((long)pIVar7 + lVar14 * 8 + -0x19c4);
        fVar34 = (pIVar7->IO).MousePos.y - *(float *)((long)pIVar7 + lVar14 * 8 + -0x19c0);
        fVar33 = fVar33 * fVar33 + fVar34 * fVar34;
        uVar21 = -(uint)(fVar33 <= fVar35);
        *(uint *)((long)pIVar7 + lVar14 * 4 + -0xabc) =
             uVar21 & (uint)fVar35 | ~uVar21 & (uint)fVar33;
      }
    }
    else {
      fVar35 = pIVar7->Time;
      if ((fVar35 - *(float *)((long)pIVar7 + lVar14 * 4 + -0xb08) <
           (pIVar7->IO).MouseDoubleClickTime) &&
         (fVar34 = (pIVar7->IO).MousePos.x - *(float *)((long)pIVar7 + lVar14 * 8 + -0x19c4),
         fVar36 = (pIVar7->IO).MousePos.y - *(float *)((long)pIVar7 + lVar14 * 8 + -0x19c0),
         fVar33 = (pIVar7->IO).MouseDoubleClickMaxDist, fVar35 = -3.4028235e+38,
         fVar34 * fVar34 + fVar36 * fVar36 < fVar33 * fVar33)) {
        *(undefined1 *)((long)(pIVar7->IO).KeyMap + lVar14 + -0x39) = 1;
        fVar35 = -3.4028235e+38;
      }
      *(float *)((long)pIVar7 + lVar14 * 4 + -0xb08) = fVar35;
      *(ImVec2 *)((long)pIVar7 + lVar14 * 8 + -0x19c4) = (pIVar7->IO).MousePos;
      *(undefined4 *)((long)pIVar7 + lVar14 * 4 + -0xabc) = 0;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x3aa);
  pfVar3 = (pIVar7->IO).KeysDownDuration;
  memcpy((pIVar7->IO).KeysDownDurationPrev,pfVar3,0x800);
  lVar14 = 0;
  do {
    fVar35 = -1.0;
    if ((pIVar7->IO).KeysDown[lVar14] == true) {
      fVar35 = 0.0;
      if (0.0 <= pfVar3[lVar14]) {
        fVar35 = pfVar3[lVar14] + (pIVar7->IO).DeltaTime;
      }
    }
    pfVar3[lVar14] = fVar35;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x200);
  fVar35 = (pIVar7->IO).DeltaTime;
  iVar10 = pIVar7->FramerateSecPerFrameIdx;
  pIVar7->FramerateSecPerFrameAccum =
       (fVar35 - pIVar7->FramerateSecPerFrame[iVar10]) + pIVar7->FramerateSecPerFrameAccum;
  pIVar7->FramerateSecPerFrame[iVar10] = fVar35;
  pIVar7->FramerateSecPerFrameIdx = (iVar10 + 1) % 10;
  (pIVar7->IO).Framerate = 1.0 / (pIVar7->FramerateSecPerFrameAccum / 10.0);
  pIVar7->HoveredIdPreviousFrame = pIVar7->HoveredId;
  pIVar7->HoveredId = 0;
  pIVar7->HoveredIdAllowOverlap = false;
  pIVar8 = GImGui;
  if ((pIVar7->ActiveIdIsAlive == false) &&
     (pIVar7->ActiveId != 0 && pIVar7->ActiveIdPreviousFrame == pIVar7->ActiveId)) {
    GImGui->ActiveId = 0;
    pIVar8->ActiveIdIsJustActivated = true;
    pIVar8->ActiveIdAllowOverlap = false;
    pIVar8->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar11 = pIVar7->ActiveId;
  IVar4 = pIVar7->MovedWindowMoveId;
  pIVar7->ActiveIdPreviousFrame = IVar11;
  pIVar7->ActiveIdIsAlive = false;
  pIVar8 = GImGui;
  pIVar7->ActiveIdIsJustActivated = false;
  if (IVar4 == IVar11 && IVar4 != 0) {
    if (GImGui->ActiveId == IVar4) {
      GImGui->ActiveIdIsAlive = true;
    }
    pIVar16 = pIVar7->MovedWindow;
    if ((pIVar16 == (ImGuiWindow *)0x0) || (pIVar16->RootWindow == (ImGuiWindow *)0x0)) {
      __assert_fail("g.MovedWindow && g.MovedWindow->RootWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x87f,"void ImGui::NewFrame()");
    }
    if (pIVar16->RootWindow->MoveId != IVar4) {
      __assert_fail("g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x880,"void ImGui::NewFrame()");
    }
    if ((pIVar7->IO).MouseDown[0] == true) {
      uVar21 = pIVar16->Flags;
      if ((uVar21 & 4) == 0) {
        (pIVar16->PosFloat).x = (pIVar7->IO).MouseDelta.x + (pIVar16->PosFloat).x;
        (pIVar16->PosFloat).y = (pIVar7->IO).MouseDelta.y + (pIVar16->PosFloat).y;
        if (((uVar21 >> 8 & 1) == 0) && (pIVar8->SettingsDirtyTimer <= 0.0)) {
          pIVar8->SettingsDirtyTimer = (pIVar8->IO).IniSavingRate;
        }
      }
      FocusWindow(pIVar16);
    }
    else {
      pIVar8->ActiveId = 0;
      pIVar8->ActiveIdIsJustActivated = true;
      pIVar8->ActiveIdAllowOverlap = false;
      pIVar8->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar7->MovedWindow = (ImGuiWindow *)0x0;
      pIVar7->MovedWindowMoveId = 0;
    }
  }
  else {
    pIVar7->MovedWindow = (ImGuiWindow *)0x0;
    pIVar7->MovedWindowMoveId = 0;
  }
  if ((0.0 < pIVar7->SettingsDirtyTimer) &&
     (fVar35 = pIVar7->SettingsDirtyTimer - (pIVar7->IO).DeltaTime,
     pIVar7->SettingsDirtyTimer = fVar35, fVar35 <= 0.0)) {
    SaveSettings();
  }
  pIVar16 = pIVar7->MovedWindow;
  pIVar15 = pIVar16;
  if (pIVar16 == (ImGuiWindow *)0x0) {
    pIVar15 = FindHoveredWindow((pIVar7->IO).MousePos,false);
  }
  pIVar7->HoveredWindow = pIVar15;
  if ((pIVar15 == (ImGuiWindow *)0x0) || ((pIVar15->Flags & 0x100000) == 0)) {
    if (pIVar16 == (ImGuiWindow *)0x0) {
      pIVar16 = FindHoveredWindow((pIVar7->IO).MousePos,true);
    }
    else {
      pIVar16 = pIVar16->RootWindow;
    }
  }
  else {
    pIVar16 = pIVar15->RootWindow;
  }
  ppIVar25 = &pIVar7->HoveredWindow;
  pIVar7->HoveredRootWindow = pIVar16;
  pIVar16 = GetFrontMostModalRootWindow();
  if (pIVar16 == (ImGuiWindow *)0x0) {
    pIVar7->ModalWindowDarkeningRatio = 0.0;
  }
  else {
    fVar35 = (pIVar7->IO).DeltaTime * 6.0 + pIVar7->ModalWindowDarkeningRatio;
    if (1.0 <= fVar35) {
      fVar35 = 1.0;
    }
    pIVar7->ModalWindowDarkeningRatio = fVar35;
    ppIVar18 = &pIVar7->HoveredRootWindow;
    do {
      pIVar15 = *ppIVar18;
      if (pIVar15 == (ImGuiWindow *)0x0) break;
      ppIVar18 = &pIVar15->ParentWindow;
    } while (pIVar15 != pIVar16);
    if (pIVar15 == (ImGuiWindow *)0x0) {
      *(undefined4 *)ppIVar25 = 0;
      *(undefined4 *)((long)&pIVar7->HoveredWindow + 4) = 0;
      *(undefined4 *)&pIVar7->HoveredRootWindow = 0;
      *(undefined4 *)((long)&pIVar7->HoveredRootWindow + 4) = 0;
    }
  }
  iVar10 = -1;
  lVar14 = 0;
  bVar9 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar14] == true) {
      bVar30 = true;
      if (*ppIVar25 == (ImGuiWindow *)0x0) {
        bVar30 = (pIVar7->OpenPopupStack).Size != 0;
      }
      (pIVar7->IO).MouseDownOwned[lVar14] = bVar30;
    }
    bVar30 = (pIVar7->IO).MouseDown[lVar14];
    if ((bVar30 == true) &&
       ((iVar10 == -1 ||
        (fVar35 = (pIVar7->IO).MouseClickedTime[iVar10],
        pfVar3 = (pIVar7->IO).MouseClickedTime + lVar14, *pfVar3 <= fVar35 && fVar35 != *pfVar3))))
    {
      iVar10 = (int)lVar14;
    }
    bVar9 = bVar9 & 1 | bVar30;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  if (iVar10 == -1) {
    cVar20 = '\x01';
  }
  else {
    cVar20 = (pIVar7->IO).MouseDownOwned[iVar10];
  }
  if (pIVar7->CaptureMouseNextFrame == -1) {
    if (((cVar20 == '\0') || ((bVar30 = true, *ppIVar25 == (ImGuiWindow *)0x0 && (bVar9 == 0)))) &&
       (bVar30 = true, pIVar7->ActiveId == 0)) {
      bVar30 = (pIVar7->OpenPopupStack).Size != 0;
    }
    (pIVar7->IO).WantCaptureMouse = bVar30;
  }
  else {
    (pIVar7->IO).WantCaptureMouse = pIVar7->CaptureMouseNextFrame != 0;
  }
  IVar11 = pIVar7->CaptureKeyboardNextFrame;
  if (IVar11 == 0xffffffff) {
    IVar11 = pIVar7->ActiveId;
  }
  (pIVar7->IO).WantCaptureKeyboard = IVar11 != 0;
  if (pIVar7->ActiveId == 0) {
    bVar30 = false;
  }
  else {
    bVar30 = (pIVar7->InputTextState).Id == pIVar7->ActiveId;
  }
  (pIVar7->IO).WantTextInput = bVar30;
  pIVar7->MouseCursor = 0;
  pIVar7->CaptureMouseNextFrame = -1;
  pIVar7->CaptureKeyboardNextFrame = -1;
  (pIVar7->OsImePosRequest).x = 1.0;
  (pIVar7->OsImePosRequest).y = 1.0;
  if (cVar20 == '\0') {
    *ppIVar25 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  pIVar16 = *ppIVar25;
  if (pIVar16 != (ImGuiWindow *)0x0) {
    fVar35 = (pIVar7->IO).MouseWheel;
    if (((fVar35 != 0.0) || (NAN(fVar35))) && (pIVar16->Collapsed == false)) {
      if ((pIVar7->IO).KeyCtrl == true) {
        if ((pIVar7->IO).FontAllowUserScaling == true) {
          fVar33 = fVar35 * 0.1 + pIVar16->FontWindowScale;
          fVar35 = 2.5;
          if (fVar33 <= 2.5) {
            fVar35 = fVar33;
          }
          fVar35 = (float)(-(uint)(fVar33 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar33 < 0.5) & (uint)fVar35);
          fVar32 = fVar35 / pIVar16->FontWindowScale;
          pIVar16->FontWindowScale = fVar35;
          fVar35 = (pIVar16->Size).x;
          fVar33 = (pIVar16->Size).y;
          fVar34 = (pIVar16->Pos).x;
          fVar36 = (pIVar16->Pos).y;
          fVar37 = (((pIVar7->IO).MousePos.x - fVar34) * fVar35 * (1.0 - fVar32)) / fVar35;
          fVar39 = (((pIVar7->IO).MousePos.y - fVar36) * (1.0 - fVar32) * fVar33) / fVar33;
          (pIVar16->Pos).x = fVar34 + fVar37;
          (pIVar16->Pos).y = fVar36 + fVar39;
          (pIVar16->PosFloat).x = fVar37 + (pIVar16->PosFloat).x;
          (pIVar16->PosFloat).y = fVar39 + (pIVar16->PosFloat).y;
          (pIVar16->Size).x = fVar35 * fVar32;
          (pIVar16->Size).y = fVar33 * fVar32;
          (pIVar16->SizeFull).x = (pIVar16->SizeFull).x * fVar32;
          (pIVar16->SizeFull).y = fVar32 * (pIVar16->SizeFull).y;
        }
      }
      else if ((pIVar16->Flags & 0x10U) == 0) {
        fVar33 = (pIVar16->Scroll).y;
        fVar34 = (pIVar16->DC).CursorMaxPos.y;
        fVar35 = fVar33 - GImGui->FontBaseSize * pIVar16->FontWindowScale * fVar35 *
                          (float)(byte)((((uint)pIVar16->Flags >> 0x17 & 1) == 0) * '\x02' + 3);
        (pIVar16->Scroll).y = fVar35;
        (pIVar16->DC).CursorMaxPos.y = (fVar33 + fVar34) - fVar35;
      }
    }
  }
  if (((pIVar7->ActiveId == 0) && (pIVar7->FocusedWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar7->FocusedWindow->Active == true &&
      (bVar30 = IsKeyPressed((GImGui->IO).KeyMap[0],false), bVar30)))) {
    pIVar7->FocusedWindow->FocusIdxTabRequestNext = 0;
  }
  uVar21 = (pIVar7->Windows).Size;
  uVar17 = (ulong)uVar21;
  if (uVar17 != 0) {
    uVar22 = 0;
    if (0 < (int)uVar21) {
      uVar22 = (ulong)uVar21;
    }
    uVar24 = 0;
    do {
      if (uVar22 == uVar24) {
        pcVar12 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001318c2;
      }
      pIVar16 = (pIVar7->Windows).Data[uVar24];
      pIVar16->WasActive = pIVar16->Active;
      pIVar16->Active = false;
      pIVar16->Accessed = false;
      uVar24 = uVar24 + 1;
    } while (uVar17 != uVar24);
  }
  if (((pIVar7->FocusedWindow != (ImGuiWindow *)0x0) && (0 < (int)uVar21)) &&
     (pIVar7->FocusedWindow->WasActive == false)) {
    lVar14 = uVar17 + 1;
    do {
      pIVar16 = (pIVar7->Windows).Data[lVar14 + -2];
      if ((pIVar16->WasActive == true) && ((pIVar16->Flags & 0x100000) == 0)) {
        FocusWindow(pIVar16);
        break;
      }
      lVar14 = lVar14 + -1;
    } while (1 < lVar14);
  }
  pIVar8 = GImGui;
  iVar10 = (pIVar7->CurrentWindowStack).Capacity;
  if (iVar10 < 0) {
    uVar21 = iVar10 / 2 + iVar10;
    uVar17 = 0;
    if (0 < (int)uVar21) {
      uVar17 = (ulong)uVar21;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    ppIVar18 = (ImGuiWindow **)(*(pIVar8->IO).MemAllocFn)(uVar17 * 8);
    ppIVar25 = (pIVar7->CurrentWindowStack).Data;
    if (ppIVar25 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar18,ppIVar25,(long)(pIVar7->CurrentWindowStack).Size << 3);
    }
    ppIVar25 = (pIVar7->CurrentWindowStack).Data;
    if (ppIVar25 != (ImGuiWindow **)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(ppIVar25);
    (pIVar7->CurrentWindowStack).Data = ppIVar18;
    (pIVar7->CurrentWindowStack).Capacity = (int)uVar17;
  }
  (pIVar7->CurrentWindowStack).Size = 0;
  pIVar8 = GImGui;
  iVar10 = (pIVar7->CurrentPopupStack).Capacity;
  if (iVar10 < 0) {
    uVar21 = iVar10 / 2 + iVar10;
    uVar17 = 0;
    if (0 < (int)uVar21) {
      uVar17 = (ulong)uVar21;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar19 = (ImGuiPopupRef *)(*(pIVar8->IO).MemAllocFn)(uVar17 * 0x28);
    pIVar6 = (pIVar7->CurrentPopupStack).Data;
    if (pIVar6 != (ImGuiPopupRef *)0x0) {
      memcpy(pIVar19,pIVar6,(long)(pIVar7->CurrentPopupStack).Size * 0x28);
    }
    pIVar6 = (pIVar7->CurrentPopupStack).Data;
    if (pIVar6 != (ImGuiPopupRef *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pIVar6);
    (pIVar7->CurrentPopupStack).Data = pIVar19;
    (pIVar7->CurrentPopupStack).Capacity = (int)uVar17;
  }
  (pIVar7->CurrentPopupStack).Size = 0;
  pIVar7 = GImGui;
  uVar21 = (GImGui->OpenPopupStack).Size;
  uVar17 = (ulong)uVar21;
  if (uVar17 != 0) {
    uVar22 = 0;
    if (0 < (int)uVar21 && GImGui->FocusedWindow != (ImGuiWindow *)0x0) {
      pIVar6 = (GImGui->OpenPopupStack).Data;
      ppIVar25 = &pIVar6->Window;
      uVar24 = 1;
      uVar22 = 0;
      do {
        pIVar16 = pIVar6[uVar22].Window;
        if (pIVar16 != (ImGuiWindow *)0x0) {
          uVar29 = pIVar16->Flags;
          if ((uVar29 >> 0x19 & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                          ,0xd55,"void CloseInactivePopups()");
          }
          ppIVar18 = ppIVar25;
          uVar26 = uVar24;
          if ((uVar29 >> 0x14 & 1) == 0) {
            do {
              if (*ppIVar18 == (ImGuiWindow *)0x0) {
                bVar30 = false;
              }
              else {
                bVar30 = (*ppIVar18)->RootWindow == GImGui->FocusedWindow->RootWindow;
              }
              if (uVar17 <= uVar26) break;
              uVar26 = uVar26 + 1;
              ppIVar18 = ppIVar18 + 5;
            } while (!bVar30);
            if (!bVar30) goto LAB_0013173f;
          }
        }
        uVar22 = uVar22 + 1;
        uVar24 = uVar24 + 1;
        ppIVar25 = ppIVar25 + 5;
      } while (uVar22 != uVar17);
      uVar22 = (ulong)uVar21;
    }
LAB_0013173f:
    uVar29 = (uint)uVar22;
    if ((int)uVar29 < (int)uVar21) {
      iVar10 = (GImGui->OpenPopupStack).Capacity;
      if (iVar10 < (int)uVar29) {
        if (iVar10 == 0) {
          uVar21 = 8;
        }
        else {
          uVar21 = iVar10 / 2 + iVar10;
        }
        if ((int)uVar21 <= (int)uVar29) {
          uVar21 = uVar29;
        }
        if (iVar10 < (int)uVar21) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pIVar19 = (ImGuiPopupRef *)(*(pIVar7->IO).MemAllocFn)((ulong)uVar21 * 0x28);
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if (pIVar6 != (ImGuiPopupRef *)0x0) {
            memcpy(pIVar19,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x28);
          }
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if (pIVar6 != (ImGuiPopupRef *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar6);
          (pIVar7->OpenPopupStack).Data = pIVar19;
          (pIVar7->OpenPopupStack).Capacity = uVar21;
        }
      }
      (pIVar7->OpenPopupStack).Size = uVar29;
    }
  }
  pIVar7 = GImGui;
  (pIVar7->SetNextWindowSizeVal).x = 400.0;
  (pIVar7->SetNextWindowSizeVal).y = 400.0;
  pIVar7->SetNextWindowSizeCond = 4;
  local_78[0].x = 0.0;
  local_78[0].y = 0.0;
  Begin("Debug",(bool *)0x0,local_78,-1.0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    ImGuiContext& g = *GImGui;

    // Check user data
    IM_ASSERT(g.IO.DeltaTime >= 0.0f);               // Need a positive DeltaTime (zero is tolerated but will cause some timing issues)
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f);
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0);           // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded());     // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f);  // Invalid style setting

    if (!g.Initialized)
    {
        // Initialize on first frame
        g.LogClipboard = (ImGuiTextBuffer*)ImGui::MemAlloc(sizeof(ImGuiTextBuffer));
        IM_PLACEMENT_NEW(g.LogClipboard) ImGuiTextBuffer();

        IM_ASSERT(g.Settings.empty());
        LoadSettings();
        g.Initialized = true;
    }

    SetCurrentFont(g.IO.Fonts->Fonts[0]);

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.Tooltip[0] = '\0';
    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.RenderDrawData.Valid = false;
    g.RenderDrawData.CmdLists = NULL;
    g.RenderDrawData.CmdListsCount = g.RenderDrawData.TotalVtxCount = g.RenderDrawData.TotalIdxCount = 0;

    // Update inputs state
    if (g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0)
        g.IO.MousePos = ImVec2(-9999.0f, -9999.0f);
    if ((g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0) || (g.IO.MousePosPrev.x < 0 && g.IO.MousePosPrev.y < 0))   // if mouse just appeared or disappeared (negative coordinate) we cancel out movement in MouseDelta
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    else
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if (g.Time - g.IO.MouseClickedTime[i] < g.IO.MouseDoubleClickTime)
            {
                if (ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -FLT_MAX;    // so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]));
        }
    }
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = 1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame));

    // Clear reference to active widget if the widget isn't alive anymore
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        SetActiveID(0);
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;

    // Handle user moving window (at the beginning of the frame to avoid input lag or sheering). Only valid for root windows.
    if (g.MovedWindowMoveId && g.MovedWindowMoveId == g.ActiveId)
    {
        KeepAliveID(g.MovedWindowMoveId);
        IM_ASSERT(g.MovedWindow && g.MovedWindow->RootWindow);
        IM_ASSERT(g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId);
        if (g.IO.MouseDown[0])
        {
            if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoMove))
            {
                g.MovedWindow->PosFloat += g.IO.MouseDelta;
                if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoSavedSettings))
                    MarkSettingsDirty();
            }
            FocusWindow(g.MovedWindow);
        }
        else
        {
            SetActiveID(0);
            g.MovedWindow = NULL;
            g.MovedWindowMoveId = 0;
        }
    }
    else
    {
        g.MovedWindow = NULL;
        g.MovedWindowMoveId = 0;
    }

    // Delay saving settings so we don't spam disk too much
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveSettings();
    }

    // Find the window we are hovering. Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow
    g.HoveredWindow = g.MovedWindow ? g.MovedWindow : FindHoveredWindow(g.IO.MousePos, false);
    if (g.HoveredWindow && (g.HoveredWindow->Flags & ImGuiWindowFlags_ChildWindow))
        g.HoveredRootWindow = g.HoveredWindow->RootWindow;
    else
        g.HoveredRootWindow = g.MovedWindow ? g.MovedWindow->RootWindow : FindHoveredWindow(g.IO.MousePos, true);

    if (ImGuiWindow* modal_window = GetFrontMostModalRootWindow())
    {
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
        ImGuiWindow* window = g.HoveredRootWindow;
        while (window && window != modal_window)
            window = window->ParentWindow;
        if (!window)
            g.HoveredRootWindow = g.HoveredWindow = NULL;
    }
    else
    {
        g.ModalWindowDarkeningRatio = 0.0f;
    }

    // Are we using inputs? Tell user so they can capture/discard the inputs away from the rest of their application.
    // When clicking outside of a window we assume the click is owned by the application and won't request capture. We need to track click ownership.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[mouse_earliest_button_down] > g.IO.MouseClickedTime[i])
                mouse_earliest_button_down = i;
    }
    bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];
    if (g.CaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.CaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.ActiveId != 0) || (!g.OpenPopupStack.empty());
    g.IO.WantCaptureKeyboard = (g.CaptureKeyboardNextFrame != -1) ? (g.CaptureKeyboardNextFrame != 0) : (g.ActiveId != 0);
    g.IO.WantTextInput = (g.ActiveId != 0 && g.InputTextState.Id == g.ActiveId);
    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.CaptureMouseNextFrame = g.CaptureKeyboardNextFrame = -1;
    g.OsImePosRequest = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    if (!mouse_avail_to_imgui)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Scale & Scrolling
    if (g.HoveredWindow && g.IO.MouseWheel != 0.0f && !g.HoveredWindow->Collapsed)
    {
        ImGuiWindow* window = g.HoveredWindow;
        if (g.IO.KeyCtrl)
        {
            if (g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->PosFloat += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
        }
        else if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
        {
            // Scroll
            const int scroll_lines = (window->Flags & ImGuiWindowFlags_ComboBox) ? 3 : 5;
            SetWindowScrollY(window, window->Scroll.y - g.IO.MouseWheel * window->CalcFontSize() * scroll_lines);
        }
    }

    // Pressing TAB activate widget focus
    // NB: Don't discard FocusedWindow if it isn't active, so that a window that go on/off programatically won't lose its keyboard focus.
    if (g.ActiveId == 0 && g.FocusedWindow != NULL && g.FocusedWindow->Active && IsKeyPressedMap(ImGuiKey_Tab, false))
        g.FocusedWindow->FocusIdxTabRequestNext = 0;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->Accessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.FocusedWindow && !g.FocusedWindow->WasActive)
        for (int i = g.Windows.Size-1; i >= 0; i--)
            if (g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
            {
                FocusWindow(g.Windows[i]);
                break;
            }

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    CloseInactivePopups();

    // Create implicit window - we will only render it if the user has added something to it.
    ImGui::SetNextWindowSize(ImVec2(400,400), ImGuiSetCond_FirstUseEver);
    ImGui::Begin("Debug");
}